

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.cpp
# Opt level: O1

unique_ptr<pstore::region::factory,_std::default_delete<pstore::region::factory>_> __thiscall
pstore::region::get_factory
          (region *this,shared_ptr<pstore::file::file_handle> *file,uint64_t full_size,
          uint64_t min_size)

{
  file_based_factory *this_00;
  shared_ptr<pstore::file::file_handle> local_38;
  
  this_00 = (file_based_factory *)operator_new(0x28);
  local_38.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (file->super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (file->super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  if (local_38.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_38.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_38.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  file_based_factory::file_based_factory(this_00,&local_38,full_size,min_size);
  if (local_38.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  *(file_based_factory **)this = this_00;
  return (__uniq_ptr_data<pstore::region::factory,_std::default_delete<pstore::region::factory>,_true,_true>
          )(__uniq_ptr_data<pstore::region::factory,_std::default_delete<pstore::region::factory>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<factory> get_factory (std::shared_ptr<file::file_handle> const & file,
                                              std::uint64_t full_size, std::uint64_t min_size) {
            return std::make_unique<file_based_factory> (file, full_size, min_size);
        }